

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O3

int Abc_TtReadHex(word *pTruth,char *pString)

{
  uint uVar1;
  word wVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  bVar3 = *pString;
  if (bVar3 == 0x30) {
    pString = pString + (ulong)(pString[1] == 'x') * 2;
    bVar3 = *pString;
  }
  uVar5 = 2;
  uVar1 = 1;
  if (((byte)(bVar3 - 0x3a) < 0xf6) && (uVar8 = 0, (byte)((bVar3 & 0xdf) + 0xb9) < 0xfa))
  goto LAB_0074bfe2;
  uVar8 = 0;
  do {
    do {
      uVar6 = uVar8;
      uVar8 = uVar6 + 1;
    } while (0xf5 < (byte)(((byte *)pString)[uVar6 + 1] - 0x3a));
  } while (0xf9 < (byte)((((byte *)pString)[uVar6 + 1] & 0xdf) + 0xb9));
  if ((int)uVar8 == 1) {
    uVar1 = 1;
    if (bVar3 < 0x41) {
      if (bVar3 != 0x30) {
        uVar8 = 1;
        if (bVar3 != 0x35) goto LAB_0074bfe2;
        goto LAB_0074c0db;
      }
LAB_0074bfd2:
      wVar2 = -(ulong)(bVar3 != 0x30);
    }
    else {
      if (bVar3 != 0x41) {
        uVar8 = 1;
        if (bVar3 != 0x46) goto LAB_0074bfe2;
        goto LAB_0074bfd2;
      }
LAB_0074c0db:
      wVar2 = 0xaaaaaaaaaaaaaaaa;
      if (bVar3 == 0x35) {
        wVar2 = 0x5555555555555555;
      }
    }
  }
  else {
    if ((int)uVar8 == 0) {
LAB_0074bfe2:
      memset(pTruth,0,(ulong)uVar1 << 3);
    }
    else {
      uVar4 = 0x1f;
      if ((uint)uVar6 != 0) {
        for (; (uint)uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
      uVar5 = 0x22 - uVar4;
      if ((uVar5 < 7) || (uVar1 = 1 << (0x1cU - (char)uVar4 & 0x1f), uVar4 != 0xfffffffd))
      goto LAB_0074bfe2;
    }
    wVar2 = 0xffffffa9;
    if ((int)uVar8 != 0) {
      uVar6 = 0;
      do {
        bVar3 = ((byte *)pString)[~uVar6 + (long)(int)uVar8];
        iVar7 = -0x30;
        if (((9 < (byte)(bVar3 - 0x30)) && (iVar7 = -0x37, 5 < (byte)(bVar3 + 0xbf))) &&
           (iVar7 = -0x57, 5 < (byte)(bVar3 + 0x9f))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                        ,0x4bf,"int Abc_TtReadHexDigit(char)");
        }
        pTruth[uVar6 >> 4 & 0xfffffff] =
             pTruth[uVar6 >> 4 & 0xfffffff] |
             (ulong)(iVar7 + (uint)bVar3) << ((char)uVar6 * '\x04' & 0x3fU);
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uVar8 & 0xffffffff));
    }
    if (5 < (int)uVar5) goto LAB_0074c0d0;
    if ((int)uVar5 < 0) {
      __assert_fail("nVars >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x489,"word Abc_Tt6Stretch(word, int)");
    }
    uVar8 = *pTruth;
    uVar1 = ((uint)uVar8 & 3) * 5;
    if (1 < uVar5) {
      uVar1 = (uint)uVar8;
    }
    bVar3 = (byte)(uVar1 << 4) | (byte)uVar1 & 0xf;
    if (2 < uVar5) {
      bVar3 = (byte)uVar8;
    }
    uVar6 = (ulong)CONCAT11(bVar3,bVar3);
    uVar1 = 3;
    if (3 < uVar5) {
      uVar6 = uVar8;
      uVar1 = uVar5;
    }
    uVar8 = (ulong)((uint)uVar6 << 0x10 | (uint)uVar6 & 0xffff);
    if (1 < uVar1 - 3) {
      uVar8 = uVar6;
    }
    wVar2 = (uVar8 & 0xffffffff) * 0x100000001;
  }
  *pTruth = wVar2;
LAB_0074c0d0:
  return (int)wVar2;
}

Assistant:

static inline int Abc_TtReadHex( word * pTruth, char * pString )
{
    int k, nVars, Digit, nDigits;
    // skip the first 2 symbols if they are "0x"
    if ( pString[0] == '0' && pString[1] == 'x' )
        pString += 2;
    // count the number of hex digits
    nDigits = 0;
    for ( k = 0; Abc_TtIsHexDigit(pString[k]); k++ )
        nDigits++;
    if ( nDigits == 1 )
    {
        if ( pString[0] == '0' || pString[0] == 'F' )
        {
            pTruth[0] = (pString[0] == '0') ? 0 : ~(word)0;
            return 0;
        }
        if ( pString[0] == '5' || pString[0] == 'A' )
        {
            pTruth[0] = (pString[0] == '5') ? s_Truths6Neg[0] : s_Truths6[0];
            return 1;
        }
    }
    // determine the number of variables
    nVars = 2 + (nDigits == 1 ? 0 : Abc_Base2Log(nDigits));
    // clean storage
    for ( k = Abc_TtWordNum(nVars) - 1; k >= 0; k-- )
        pTruth[k] = 0;
    // read hexadecimal digits in the reverse order
    // (the last symbol in the string is the least significant digit)
    for ( k = 0; k < nDigits; k++ )
    {
        Digit = Abc_TtReadHexDigit( pString[nDigits - 1 - k] );
        assert( Digit >= 0 && Digit < 16 );
        Abc_TtSetHex( pTruth, k, Digit );
    }
    if ( nVars < 6 )
        pTruth[0] = Abc_Tt6Stretch( pTruth[0], nVars );
    return nVars;
}